

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O1

FT_Error cff_get_ros(CFF_Face face,char **registry,char **ordering,FT_Int *supplement)

{
  uint uVar1;
  void *pvVar2;
  undefined8 uVar3;
  
  pvVar2 = (face->extra).data;
  if (pvVar2 == (void *)0x0) {
    return 0;
  }
  uVar1 = *(uint *)((long)pvVar2 + 0x74c);
  if (uVar1 == 0xffff) {
    return 6;
  }
  if (registry != (char **)0x0) {
    if (*(long *)((long)pvVar2 + 0x1378) == 0) {
      if (uVar1 < 0x187) {
        if (*(long *)((long)pvVar2 + 0x1360) == 0) goto LAB_001fd3c4;
        uVar3 = (**(code **)(*(long *)((long)pvVar2 + 0x1360) + 0x28))();
      }
      else if (uVar1 - 0x187 < *(uint *)((long)pvVar2 + 0x648)) {
        uVar3 = *(undefined8 *)(*(long *)((long)pvVar2 + 0x650) + (ulong)(uVar1 - 0x187) * 8);
      }
      else {
LAB_001fd3c4:
        uVar3 = 0;
      }
      *(undefined8 *)((long)pvVar2 + 0x1378) = uVar3;
    }
    *registry = *(char **)((long)pvVar2 + 0x1378);
  }
  if (ordering == (char **)0x0) goto LAB_001fd40e;
  if (*(long *)((long)pvVar2 + 0x1380) == 0) {
    uVar1 = *(uint *)((long)pvVar2 + 0x750);
    if (uVar1 == 0xffff) {
LAB_001fd3f9:
      uVar3 = 0;
    }
    else if (uVar1 < 0x187) {
      if (*(long *)((long)pvVar2 + 0x1360) == 0) goto LAB_001fd3f9;
      uVar3 = (**(code **)(*(long *)((long)pvVar2 + 0x1360) + 0x28))();
    }
    else {
      if (*(uint *)((long)pvVar2 + 0x648) <= uVar1 - 0x187) goto LAB_001fd3f9;
      uVar3 = *(undefined8 *)(*(long *)((long)pvVar2 + 0x650) + (ulong)(uVar1 - 0x187) * 8);
    }
    *(undefined8 *)((long)pvVar2 + 0x1380) = uVar3;
  }
  *ordering = *(char **)((long)pvVar2 + 0x1380);
LAB_001fd40e:
  if (supplement != (FT_Int *)0x0) {
    *supplement = *(FT_Int *)((long)pvVar2 + 0x758);
  }
  return 0;
}

Assistant:

static FT_Error
  cff_get_ros( CFF_Face      face,
               const char*  *registry,
               const char*  *ordering,
               FT_Int       *supplement )
  {
    FT_Error  error = FT_Err_Ok;
    CFF_Font  cff   = (CFF_Font)face->extra.data;


    if ( cff )
    {
      CFF_FontRecDict  dict = &cff->top_font.font_dict;


      if ( dict->cid_registry == 0xFFFFU )
      {
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }

      if ( registry )
      {
        if ( !cff->registry )
          cff->registry = cff_index_get_sid_string( cff,
                                                    dict->cid_registry );
        *registry = cff->registry;
      }

      if ( ordering )
      {
        if ( !cff->ordering )
          cff->ordering = cff_index_get_sid_string( cff,
                                                    dict->cid_ordering );
        *ordering = cff->ordering;
      }

      /*
       * XXX: According to Adobe TechNote #5176, the supplement in CFF
       *      can be a real number. We truncate it to fit public API
       *      since freetype-2.3.6.
       */
      if ( supplement )
      {
        if ( dict->cid_supplement < FT_INT_MIN ||
             dict->cid_supplement > FT_INT_MAX )
          FT_TRACE1(( "cff_get_ros: too large supplement %d is truncated\n",
                      dict->cid_supplement ));
        *supplement = (FT_Int)dict->cid_supplement;
      }
    }

  Fail:
    return error;
  }